

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O2

void __thiscall Nova::Simplex_Mesh<4>::Initialize_Adjacent_Elements(Simplex_Mesh<4> *this)

{
  pointer pVVar1;
  pointer pVVar2;
  Array<Nova::Array<int>_> *pAVar3;
  Vector<int,_4,_true> *pVVar4;
  int i;
  int iVar5;
  size_t t;
  ulong uVar6;
  int local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  pAVar3 = this->adjacent_elements;
  if (pAVar3 != (Array<Nova::Array<int>_> *)0x0) {
    std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::~vector(&pAVar3->_data);
    operator_delete(pAVar3);
  }
  pAVar3 = (Array<Nova::Array<int>_> *)operator_new(0x18);
  pVVar1 = (this->elements)._data.
           super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->elements)._data.
           super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_4c = 0;
  Array<int>::Array((Array<int> *)&local_48,0,&local_4c);
  Array<Nova::Array<int>_>::Array(pAVar3,(long)pVVar2 - (long)pVVar1 >> 4,(Array<int> *)&local_48);
  this->adjacent_elements = pAVar3;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  pAVar3 = this->incident_elements;
  if (pAVar3 == (Array<Nova::Array<int>_> *)0x0) {
    Initialize_Incident_Elements(this);
  }
  for (uVar6 = 0;
      uVar6 < (ulong)((long)(this->elements)._data.
                            super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->elements)._data.
                            super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar6 = uVar6 + 1) {
    pVVar4 = Array<Nova::Vector<int,_4,_true>_>::operator()(&this->elements,(int)uVar6);
    for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
      Vector<int,_4,_true>::Remove_Index((Vector<int,_4,_true> *)&local_48,(int)pVVar4);
      Find_And_Append_Adjacent_Elements(this,(int)uVar6,(Vector<int,_3,_true> *)&local_48);
    }
  }
  if (pAVar3 == (Array<Nova::Array<int>_> *)0x0) {
    pAVar3 = this->incident_elements;
    if (pAVar3 != (Array<Nova::Array<int>_> *)0x0) {
      std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::~vector(&pAVar3->_data);
    }
    operator_delete(pAVar3);
    this->incident_elements = (Array<Nova::Array<int>_> *)0x0;
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Initialize_Adjacent_Elements()
{
    if(adjacent_elements!=nullptr) delete adjacent_elements;
    adjacent_elements=new Array<Array<int>>(elements.size());
    
    bool incident_elements_defined=(incident_elements!=nullptr);
    if(!incident_elements_defined) Initialize_Incident_Elements();

    for(size_t t=0;t<elements.size();++t){const INDEX& element=elements(t);
        for(int i=0;i<d;++i) Find_And_Append_Adjacent_Elements(t,element.Remove_Index(i));}
    if(!incident_elements_defined){delete incident_elements;incident_elements=nullptr;}
}